

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::register_custom_layer(Net *this,char *type,layer_creator_func creator)

{
  pointer plVar1;
  int iVar2;
  int iVar3;
  layer_registry_entry entry;
  
  iVar2 = layer_to_index(type);
  if (iVar2 == -1) {
    iVar3 = custom_layer_to_index(this,type);
    if (iVar3 == -1) {
      entry.name = type;
      entry.creator = creator;
      std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
      push_back(&this->custom_layer_registry,&entry);
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      fprintf(_stderr,"overwrite existing custom layer type %s\n",type);
      plVar1 = (this->custom_layer_registry).
               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar1[iVar3].name = type;
      plVar1[iVar3].creator = creator;
    }
  }
  else {
    fprintf(_stderr,"can not register build-in layer type %s\n",type);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        fprintf(stderr, "can not register build-in layer type %s\n", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct layer_registry_entry entry = { type, creator };
        custom_layer_registry.push_back(entry);
    }
    else
    {
        fprintf(stderr, "overwrite existing custom layer type %s\n", type);
        custom_layer_registry[custom_index].name = type;
        custom_layer_registry[custom_index].creator = creator;
    }

    return 0;
}